

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O3

bool __thiscall
i2p::sam::Session::Connect(Session *this,CService *to,Connection *conn,bool *proxy_error)

{
  Sock *pSVar1;
  long lVar2;
  _Head_base<0UL,_Sock_*,_false> _Var3;
  uint32_t uVar4;
  undefined8 sock;
  bool bVar5;
  uint16_t uVar6;
  int iVar7;
  Logger *this_00;
  runtime_error *prVar8;
  string *request;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock11;
  undefined1 local_198 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  undefined1 local_168 [120];
  undefined1 local_f0 [32];
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock10;
  undefined1 local_c0 [48];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_90;
  string session_id;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)proxy_error;
  uVar6 = CService::GetPort(to);
  if (uVar6 == 0) {
    *proxy_error = true;
    session_id._M_dataplus._M_p = (pointer)&session_id.field_2;
    session_id._M_string_length = 0;
    session_id.field_2._M_local_buf[0] = '\0';
    prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&conn->peer,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)to);
    uVar4 = (to->super_CNetAddr).m_scope_id;
    (conn->peer).super_CNetAddr.m_net = (to->super_CNetAddr).m_net;
    (conn->peer).super_CNetAddr.m_scope_id = uVar4;
    (conn->peer).port = to->port;
    criticalblock10.super_unique_lock._M_owns = false;
    criticalblock10.super_unique_lock._M_device = &(this->m_mutex).super_mutex;
    std::unique_lock<std::mutex>::lock(&criticalblock10.super_unique_lock);
    CreateIfNotCreatedAlready(this);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&session_id,&this->m_session_id);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&conn->me,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&this->m_my_addr);
    uVar4 = (this->m_my_addr).super_CNetAddr.m_scope_id;
    (conn->me).super_CNetAddr.m_net = (this->m_my_addr).super_CNetAddr.m_net;
    (conn->me).super_CNetAddr.m_scope_id = uVar4;
    (conn->me).port = (this->m_my_addr).port;
    Hello((Session *)local_168);
    sock = local_168._0_8_;
    std::unique_lock<std::mutex>::~unique_lock(&criticalblock10.super_unique_lock);
    CNetAddr::ToStringAddr_abi_cxx11_((string *)local_f0,&to->super_CNetAddr);
    tinyformat::format<std::__cxx11::string>
              ((string *)local_168,(tinyformat *)"NAMING LOOKUP NAME=%s",local_f0,pbVar9);
    pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
    SendRequestAndGetReply((Reply *)&criticalblock10,this,(Sock *)sock,(string *)local_168,true);
    pSVar1 = (Sock *)(local_168 + 0x10);
    if ((Sock *)local_168._0_8_ != pSVar1) {
      operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
    }
    if ((CThreadInterrupt *)local_f0._0_8_ != (CThreadInterrupt *)(local_f0 + 0x10)) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
    }
    local_168._0_8_ = pSVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"VALUE","");
    Reply::Get((string *)local_f0,(Reply *)&criticalblock10,(string *)local_168);
    if ((Sock *)local_168._0_8_ != pSVar1) {
      operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
    }
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              ((string *)(local_198 + 0x10),
               (tinyformat *)"STREAM CONNECT ID=%s DESTINATION=%s SILENT=false",(char *)&session_id,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,pbVar9)
    ;
    request = (string *)(local_198 + 0x10);
    SendRequestAndGetReply((Reply *)local_168,this,(Sock *)sock,request,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._16_8_ != &local_178) {
      operator_delete((void *)local_198._16_8_,local_178._M_allocated_capacity + 1);
    }
    criticalblock11.super_unique_lock._M_device = (mutex_type *)local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)&criticalblock11,"RESULT","");
    Reply::Get((string *)(local_198 + 0x10),(Reply *)local_168,(string *)&criticalblock11);
    if (criticalblock11.super_unique_lock._M_device != (mutex_type *)local_198) {
      operator_delete(criticalblock11.super_unique_lock._M_device,local_198._0_8_ + 1);
    }
    iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_198 + 0x10),"OK");
    if (iVar7 != 0) {
      iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_198 + 0x10),"INVALID_ID");
      if (iVar7 == 0) {
        criticalblock11.super_unique_lock._M_owns = false;
        criticalblock11.super_unique_lock._M_device = &(this->m_mutex).super_mutex;
        std::unique_lock<std::mutex>::lock(&criticalblock11.super_unique_lock);
        Disconnect(this);
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar8,"Invalid session id");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_008797a8;
      }
      iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_198 + 0x10),"CANT_REACH_PEER");
      if (iVar7 == 0) {
LAB_00879512:
        *proxy_error = false;
      }
      else {
        iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_198 + 0x10),"TIMEOUT");
        if (iVar7 == 0) goto LAB_00879512;
      }
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      tinyformat::format<std::__cxx11::string>
                ((string *)&criticalblock11,(tinyformat *)0xf6fc25,local_168,request);
      std::runtime_error::runtime_error(prVar8,(string *)&criticalblock11);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_008797a8;
    }
    _Var3._M_head_impl =
         (conn->sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
         super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
         super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
    (conn->sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
    super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.super__Head_base<0UL,_Sock_*,_false>.
    _M_head_impl = (Sock *)sock;
    if (_Var3._M_head_impl != (Sock *)0x0) {
      (**(code **)((long)(_Var3._M_head_impl)->_vptr_Sock + 8))();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._16_8_ != &local_178) {
      operator_delete((void *)local_198._16_8_,local_178._M_allocated_capacity + 1);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_168 + 0x40));
    if ((_Impl *)local_168._32_8_ != (_Impl *)(local_168 + 0x30)) {
      operator_delete((void *)local_168._32_8_,local_168._48_8_ + 1);
    }
    if ((Sock *)local_168._0_8_ != pSVar1) {
      operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
    }
    if ((CThreadInterrupt *)local_f0._0_8_ != (CThreadInterrupt *)(local_f0 + 0x10)) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_90);
    if ((undefined1 *)local_c0._16_8_ != local_c0 + 0x20) {
      operator_delete((void *)local_c0._16_8_,(ulong)(local_c0._32_8_ + 1));
    }
    if (criticalblock10.super_unique_lock._M_device != (mutex_type *)local_c0) {
      operator_delete(criticalblock10.super_unique_lock._M_device,local_c0._0_8_ + 1);
    }
    bVar5 = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)session_id._M_dataplus._M_p != &session_id.field_2) {
      operator_delete(session_id._M_dataplus._M_p,
                      CONCAT71(session_id.field_2._M_allocated_capacity._1_7_,
                               session_id.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    this_00 = LogInstance();
    bVar5 = BCLog::Logger::WillLogCategoryLevel(this_00,I2P,Debug);
    if (bVar5) {
      CService::ToStringAddrPort_abi_cxx11_((string *)&criticalblock10,to);
      uVar6 = CService::GetPort(to);
      local_168._0_2_ = uVar6;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/i2p.cpp"
      ;
      source_file._M_len = 0x57;
      logging_function._M_str = "Connect";
      logging_function._M_len = 7;
      LogPrintFormatInternal<std::__cxx11::string,unsigned_short>
                (logging_function,source_file,0xe2,I2P,Debug,(ConstevalFormatString<2U>)0xf6fadf,
                 (string *)&criticalblock10,(unsigned_short *)local_168);
      if (criticalblock10.super_unique_lock._M_device != (mutex_type *)local_c0) {
        operator_delete(criticalblock10.super_unique_lock._M_device,local_c0._0_8_ + 1);
      }
    }
    *proxy_error = false;
    bVar5 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar5;
  }
LAB_008797a8:
  __stack_chk_fail();
}

Assistant:

bool Session::Connect(const CService& to, Connection& conn, bool& proxy_error)
{
    // Refuse connecting to arbitrary ports. We don't specify any destination port to the SAM proxy
    // when connecting (SAM 3.1 does not use ports) and it forces/defaults it to I2P_SAM31_PORT.
    if (to.GetPort() != I2P_SAM31_PORT) {
        LogPrintLevel(BCLog::I2P, BCLog::Level::Debug, "Error connecting to %s, connection refused due to arbitrary port %s\n", to.ToStringAddrPort(), to.GetPort());
        proxy_error = false;
        return false;
    }

    proxy_error = true;

    std::string session_id;
    std::unique_ptr<Sock> sock;
    conn.peer = to;

    try {
        {
            LOCK(m_mutex);
            CreateIfNotCreatedAlready();
            session_id = m_session_id;
            conn.me = m_my_addr;
            sock = Hello();
        }

        const Reply& lookup_reply =
            SendRequestAndGetReply(*sock, strprintf("NAMING LOOKUP NAME=%s", to.ToStringAddr()));

        const std::string& dest = lookup_reply.Get("VALUE");

        const Reply& connect_reply = SendRequestAndGetReply(
            *sock, strprintf("STREAM CONNECT ID=%s DESTINATION=%s SILENT=false", session_id, dest),
            false);

        const std::string& result = connect_reply.Get("RESULT");

        if (result == "OK") {
            conn.sock = std::move(sock);
            return true;
        }

        if (result == "INVALID_ID") {
            LOCK(m_mutex);
            Disconnect();
            throw std::runtime_error("Invalid session id");
        }

        if (result == "CANT_REACH_PEER" || result == "TIMEOUT") {
            proxy_error = false;
        }

        throw std::runtime_error(strprintf("\"%s\"", connect_reply.full));
    } catch (const std::runtime_error& e) {
        LogPrintLevel(BCLog::I2P, BCLog::Level::Debug, "Error connecting to %s: %s\n", to.ToStringAddrPort(), e.what());
        CheckControlSock();
        return false;
    }
}